

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

string * __thiscall
dmlc::StackTrace_abi_cxx11_
          (string *__return_storage_ptr__,dmlc *this,size_t start_frame,size_t stack_size)

{
  int iVar1;
  void *__ptr;
  ostream *poVar2;
  char *msg_str;
  char *extraout_RDX;
  long lVar3;
  undefined1 auVar4 [16];
  vector<void_*,_std::allocator<void_*>_> stack;
  string msg;
  ostringstream stacktrace_os;
  _Vector_base<void_*,_std::allocator<void_*>_> local_1e0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_1e0,start_frame,
             (allocator_type *)&local_1c8);
  iVar1 = backtrace(local_1e0._M_impl.super__Vector_impl_data._M_start,start_frame & 0xffffffff);
  std::operator<<((ostream *)local_1a8,"Stack trace:\n");
  auVar4 = backtrace_symbols(local_1e0._M_impl.super__Vector_impl_data._M_start,iVar1);
  msg_str = auVar4._8_8_;
  __ptr = auVar4._0_8_;
  if (__ptr != (void *)0x0) {
    for (lVar3 = (long)(int)this; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      Demangle_abi_cxx11_(&local_1c8,*(dmlc **)((long)__ptr + lVar3 * 8),msg_str);
      poVar2 = std::operator<<((ostream *)local_1a8,"  [bt] (");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,") ");
      poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      msg_str = extraout_RDX;
    }
  }
  free(__ptr);
  std::__cxx11::stringbuf::str();
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StackTrace(
    size_t start_frame = 1,
    const size_t stack_size = DMLC_LOG_STACK_TRACE_SIZE) {
  using std::string;
  std::ostringstream stacktrace_os;
  std::vector<void*> stack(stack_size);
  int nframes = backtrace(stack.data(), static_cast<int>(stack_size));
  stacktrace_os << "Stack trace:\n";
  char **msgs = backtrace_symbols(stack.data(), nframes);
  if (msgs != nullptr) {
    for (int frameno = start_frame; frameno < nframes; ++frameno) {
      string msg = dmlc::Demangle(msgs[frameno]);
      stacktrace_os << "  [bt] (" << frameno - start_frame << ") " << msg << "\n";
    }
  }
  free(msgs);
  string stack_trace = stacktrace_os.str();
  return stack_trace;
}